

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Signal *this;
  Config *pCVar3;
  char *pcVar4;
  size_t __n;
  LogStream *this_00;
  char **ppcVar5;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  SourceFile file_07;
  SourceFile file_08;
  Logger LStack_ff8;
  
  g_stopEvent = 0;
  g_filep = (FILE *)fopen("../flyd_log","ae");
  if ((FILE *)g_filep == (FILE *)0x0) {
    puts(&DAT_0011d184);
  }
  muduo::Logger::setOutput(dummyOutput);
  muduo::Logger::setFlush(dummyFlush);
  muduo::Logger::setLogLevel(DEBUG);
  this = flyd::Singleton<flyd::Signal>::getInstance();
  flyd::Signal::Init(this);
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  bVar1 = flyd::Config::Load(pCVar3,"../flyd.conf");
  if (!bVar1) {
    file._8_8_ = 7;
    file.data_ = "main.cc";
    muduo::Logger::Logger(&LStack_ff8,file,0x43,FATAL);
    if (0x25 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"配置文件读取失败，退出！\n"
                      ,0x25);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x25;
    }
    muduo::Logger::~Logger(&LStack_ff8);
  }
  CMemory::GetInstance();
  CCRC32::GetInstance();
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  iVar2 = flyd::Config::GetIntDefault(pCVar3,"ListenPort",0);
  if (muduo::g_logLevel < 3) {
    file_00._8_8_ = 7;
    file_00.data_ = "main.cc";
    muduo::Logger::Logger(&LStack_ff8,file_00,0x4e);
    if (6 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"port =",6);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 6;
    }
    muduo::LogStream::operator<<(&LStack_ff8.impl_.stream_,iVar2);
    muduo::Logger::~Logger(&LStack_ff8);
  }
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  pcVar4 = flyd::Config::GetString(pCVar3,"DBInfo");
  if (pcVar4 == (char *)0x0) {
    file_02._8_8_ = 7;
    file_02.data_ = "main.cc";
    muduo::Logger::Logger(&LStack_ff8,file_02,0x57,FATAL);
    if (0x12 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"DBInfo get failed\n",0x12);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x12;
    }
  }
  else {
    if (2 < muduo::g_logLevel) goto LAB_0011038a;
    file_01._8_8_ = 7;
    file_01.data_ = "main.cc";
    muduo::Logger::Logger(&LStack_ff8,file_01,0x53);
    iVar2 = (int)&LStack_ff8 + 0xfb8;
    if (9 < (uint)(iVar2 - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"DBInfo = ",9);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 9;
    }
    __n = strlen(pcVar4);
    if (__n < (ulong)(long)(iVar2 - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      memcpy(LStack_ff8.impl_.stream_.buffer_.cur_,pcVar4,__n);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + __n;
    }
  }
  muduo::Logger::~Logger(&LStack_ff8);
LAB_0011038a:
  flyd_pid = getpid();
  flyd_parent = getppid();
  if (muduo::g_logLevel < 3) {
    file_03._8_8_ = 7;
    file_03.data_ = "main.cc";
    muduo::Logger::Logger(&LStack_ff8,file_03,0x5c);
    if ((((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_ & 0xfffffff0U) != 0
       ) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"主进程pid = ",0xf);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0xf;
    }
    this_00 = muduo::LogStream::operator<<(&LStack_ff8.impl_.stream_,flyd_pid);
    ppcVar5 = &(this_00->buffer_).cur_;
    pcVar4 = (this_00->buffer_).cur_;
    if (((int)ppcVar5 - (int)pcVar4 & 0xfffffff8U) != 0) {
      builtin_strncpy(pcVar4,"ppid = ",7);
      *ppcVar5 = *ppcVar5 + 7;
    }
    muduo::LogStream::operator<<(this_00,flyd_parent);
    muduo::Logger::~Logger(&LStack_ff8);
  }
  bVar1 = CLogicSocket::Initialize(&g_socket);
  if (!bVar1) {
    file_04._8_8_ = 7;
    file_04.data_ = "main.cc";
    muduo::Logger::Logger(&LStack_ff8,file_04,0x60,FATAL);
    if (0x19 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"socket initialize failed ",0x19);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x19;
    }
    muduo::Logger::~Logger(&LStack_ff8);
  }
  iVar2 = flyd::flyd_daemon();
  if (iVar2 == -1) {
    file_05._8_8_ = 7;
    file_05.data_ = "main.cc";
    muduo::Logger::Logger(&LStack_ff8,file_05,0x66,ERROR);
    if (0x27 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,
                      "cdaemonresult:master进程创建失败\n",0x27);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x27;
    }
    muduo::Logger::~Logger(&LStack_ff8);
  }
  if (iVar2 != 1) {
    if (muduo::g_logLevel < 3) {
      file_06._8_8_ = 7;
      file_06.data_ = "main.cc";
      muduo::Logger::Logger(&LStack_ff8,file_06,0x6e);
      if (0x1b < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"master exit successfully \n ",0x1b);
        LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x1b;
      }
      muduo::Logger::~Logger(&LStack_ff8);
    }
    flyd::flyd_master_process_cycle();
    if (muduo::g_logLevel < 3) {
      file_07._8_8_ = 7;
      file_07.data_ = "main.cc";
      muduo::Logger::Logger(&LStack_ff8,file_07,0x72);
      if (0x14 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(LStack_ff8.impl_.stream_.buffer_.cur_,"exit successfully \n ",0x14);
        LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x14;
      }
      muduo::Logger::~Logger(&LStack_ff8);
    }
    return 0;
  }
  file_08._8_8_ = 7;
  file_08.data_ = "main.cc";
  muduo::Logger::Logger(&LStack_ff8,file_08,0x69,WARN);
  muduo::LogStream::operator<<(&LStack_ff8.impl_.stream_,anon_var_dwarf_553);
  muduo::Logger::~Logger(&LStack_ff8);
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
    //0表示不退出
    g_stopEvent = 0;

    g_filep = ::fopen("../flyd_log", "ae");
    if(!g_filep)
        printf("打开失败\n");
    muduo::Logger::setOutput(dummyOutput);
    muduo::Logger::setFlush(dummyFlush);
    muduo::Logger::setLogLevel(muduo::Logger::DEBUG);

    //初始化信号
    Singleton<Signal>::getInstance().Init();

     //读取配置文件
    if(!Singleton<Config>::getInstance().Load("../flyd.conf"))
    {
        LOG_FATAL<<"配置文件读取失败，退出！\n";
    }

    //内存单例类
    CMemory::GetInstance();

    //CRC校验算法单例类
    CCRC32::GetInstance();

    //得到监听端口号
    int port = Singleton<Config>::getInstance().GetIntDefault("ListenPort", 0);
    LOG_INFO << "port =" << port;
    //得到监听的地址
    const char *pDBInfo = Singleton<Config>::getInstance().GetString("DBInfo");
    if(pDBInfo != NULL)
    {
        LOG_INFO << "DBInfo = " << pDBInfo;
    }
    else
    {
        LOG_FATAL<<("DBInfo get failed\n");
    }

    flyd_pid = getpid();      //取得进程pid
    flyd_parent = getppid();     //取得父进程的id
    LOG_INFO << "主进程pid = "<< flyd_pid << "ppid = " << flyd_parent;

    if(!g_socket.Initialize())//初始化socket
    {
        LOG_FATAL << "socket initialize failed ";
    }


    int cdaemonresult = flyd_daemon();
    if(cdaemonresult == -1) //fork()失败
        LOG_ERROR << "cdaemonresult:master进程创建失败\n";
    if(cdaemonresult == 1)
    {
        LOG_WARN << "这是原始的父进程，退出\n";
      //  while(1);
        exit(0);
    }

    LOG_INFO << "master exit successfully \n " ;

    flyd_master_process_cycle();

    LOG_INFO << "exit successfully \n " ;

    return 0;
}